

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::SendMessage
          (V2TransportTester *this,uint8_t short_id,Span<const_unsigned_char> payload)

{
  size_t __n;
  long in_FS_OFFSET;
  Span<const_unsigned_char> content;
  vector<unsigned_char,_std::allocator<unsigned_char>_> contents;
  allocator_type local_49;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  long local_30;
  
  __n = payload.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,__n + 1,&local_49);
  *local_48._M_impl.super__Vector_impl_data._M_start = short_id;
  if (__n != 0) {
    memmove(local_48._M_impl.super__Vector_impl_data._M_start + 1,payload.m_data,__n);
  }
  content.m_size =
       (long)local_48._M_impl.super__Vector_impl_data._M_finish -
       (long)local_48._M_impl.super__Vector_impl_data._M_start;
  content.m_data = local_48._M_impl.super__Vector_impl_data._M_start;
  SendPacket(this,content,(Span<const_unsigned_char>)ZEXT816(0),false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SendMessage(uint8_t short_id, Span<const uint8_t> payload)
    {
        // Construct contents consisting of short_id + payload.
        std::vector<uint8_t> contents(1 + payload.size());
        contents[0] = short_id;
        std::copy(payload.begin(), payload.end(), contents.begin() + 1);
        // Send a packet with that as contents.
        SendPacket(contents);
    }